

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.h
# Opt level: O0

qpXmlAttribute * qpSetStringAttrib(qpXmlAttribute *__return_storage_ptr__,char *name,char *value)

{
  char *value_local;
  char *name_local;
  
  __return_storage_ptr__->name = name;
  __return_storage_ptr__->type = QP_XML_ATTRIBUTE_STRING;
  __return_storage_ptr__->stringValue = value;
  __return_storage_ptr__->intValue = -0x2a6;
  __return_storage_ptr__->boolValue = -1;
  return __return_storage_ptr__;
}

Assistant:

DE_INLINE qpXmlAttribute qpSetStringAttrib (const char* name, const char* value)
{
	qpXmlAttribute attrib;
	attrib.name			= name;
	attrib.type			= QP_XML_ATTRIBUTE_STRING;
	attrib.stringValue	= value;
	attrib.intValue		= -678;
	attrib.boolValue	= (deBool)0xFFFFFFFFu;
	return attrib;
}